

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseFieldOptions
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  bool bVar2;
  FieldOptions *options;
  FileDescriptorProto *containing_file_00;
  LocationRecorder location;
  
  containing_file_00 = containing_file;
  bVar1 = LookingAt(this,"[");
  bVar2 = true;
  if (bVar1) {
    LocationRecorder::LocationRecorder(&location,field_location,8);
    bVar1 = Consume(this,"[");
    if (bVar1) {
      do {
        bVar1 = LookingAt(this,"default");
        if (bVar1) {
          bVar1 = ParseDefaultAssignment(this,field,field_location,containing_file_00);
        }
        else {
          bVar1 = LookingAt(this,"json_name");
          if (bVar1) {
            bVar1 = ParseJsonName(this,field,field_location,containing_file_00);
          }
          else {
            options = FieldDescriptorProto::mutable_options(field);
            containing_file_00 = containing_file;
            bVar1 = ParseOption(this,&options->super_Message,&location,containing_file,
                                OPTION_ASSIGNMENT);
          }
        }
        if (bVar1 == false) goto LAB_002d78bc;
        bVar1 = TryConsume(this,",");
      } while (bVar1);
      bVar2 = Consume(this,"]");
    }
    else {
LAB_002d78bc:
      bVar2 = false;
    }
    LocationRecorder::~LocationRecorder(&location);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseFieldOptions(FieldDescriptorProto* field,
                               const LocationRecorder& field_location,
                               const FileDescriptorProto* containing_file) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  // Parse field options.
  do {
    if (LookingAt("default")) {
      // We intentionally pass field_location rather than location here, since
      // the default value is not actually an option.
      DO(ParseDefaultAssignment(field, field_location, containing_file));
    } else if (LookingAt("json_name")) {
      // Like default value, this "json_name" is not an actual option.
      DO(ParseJsonName(field, field_location, containing_file));
    } else {
      DO(ParseOption(field->mutable_options(), location,
                     containing_file, OPTION_ASSIGNMENT));
    }
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}